

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O3

void deqp::gles2::Functional::logComment(TestContext *testCtx,char *comment)

{
  size_t sVar1;
  undefined1 local_190 [8];
  _func_int **local_188;
  ios_base local_118 [264];
  
  local_190 = (undefined1  [8])testCtx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,"// ",3);
  if (comment == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_188 + (int)local_188[-3]);
  }
  else {
    sVar1 = strlen(comment);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_188,comment,sVar1);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

static void logComment (tcu::TestContext& testCtx, const char* comment)
{
	testCtx.getLog() << TestLog::Message << "// " << comment << TestLog::EndMessage;
}